

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O0

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (RangeSelectExpression *this,SampledValueExprVisitor *visitor)

{
  Expression *pEVar1;
  SampledValueExprVisitor *visitor_local;
  RangeSelectExpression *this_local;
  
  pEVar1 = value(this);
  Expression::visit<slang::ast::SampledValueExprVisitor&>(pEVar1,visitor);
  pEVar1 = left(this);
  Expression::visit<slang::ast::SampledValueExprVisitor&>(pEVar1,visitor);
  pEVar1 = right(this);
  Expression::visit<slang::ast::SampledValueExprVisitor&>(pEVar1,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }